

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scc.h
# Opt level: O0

void __thiscall
Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>
::Node::primal_dfs(Node *this,
                  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                  *acc)

{
  bool bVar1;
  reference ppNVar2;
  Node *i;
  const_iterator __end0;
  const_iterator __begin0;
  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
  *__range2;
  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
  *local_18;
  vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
  *acc_local;
  Node *this_local;
  
  if ((this->visited & 1U) == 0) {
    this->visited = true;
    __range2 = (vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                *)this;
    local_18 = acc;
    acc_local = (vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                 *)this;
    std::
    vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
    ::push_back(acc,(value_type *)&__range2);
    __end0 = std::
             vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
             ::begin(&this->edges);
    i = (Node *)std::
                vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>
                ::end(&this->edges);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end0,(__normal_iterator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*const_*,_std::vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>_>
                                       *)&i), bVar1) {
      ppNVar2 = __gnu_cxx::
                __normal_iterator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*const_*,_std::vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>_>
                ::operator*(&__end0);
      primal_dfs(*ppNVar2,local_18);
      __gnu_cxx::
      __normal_iterator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*const_*,_std::vector<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*,_std::allocator<const_Graph<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_scc::AssocMapType>::Node_*>_>_>
      ::operator++(&__end0);
    }
  }
  return;
}

Assistant:

void primal_dfs(std::vector<const Node *> &acc) const {
            if (visited) return;
            visited = true;
            acc.push_back(this);
            for (auto i: edges) {
                i->primal_dfs(acc);
            }
        }